

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

Vector<double,_3U> *
OpenMD::operator*(Vector<double,_3U> *__return_storage_ptr__,Vector<double,_3U> *v,
                 RectMatrix<double,_3U,_3U> *m)

{
  uint i;
  long lVar1;
  double (*padVar2) [3];
  long lVar3;
  double dVar4;
  
  Vector<double,_3U>::Vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar4 = __return_storage_ptr__->data_[lVar1];
    padVar2 = (double (*) [3])m;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar4 = dVar4 + v->data_[lVar3] * (*(double (*) [3])*padVar2)[0];
      padVar2 = padVar2 + 1;
    }
    __return_storage_ptr__->data_[lVar1] = dVar4;
    m = (RectMatrix<double,_3U,_3U> *)(*(double (*) [3])m + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<Real, Col> operator*(const Vector<Real, Row>& v,
                                     const RectMatrix<Real, Row, Col>& m) {
    Vector<Real, Row> result;

    for (unsigned int i = 0; i < Col; i++)
      for (unsigned int j = 0; j < Row; j++)
        result[i] += v[j] * m(j, i);

    return result;
  }